

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_store_fpr32(DisasContext_conflict6 *ctx,TCGv_i32 t,int reg)

{
  uintptr_t o;
  TCGv_i32 pTVar1;
  TCGTemp *ts;
  uint in_ECX;
  undefined4 in_register_00000014;
  TCGContext_conflict6 *tcg_ctx;
  TCGTemp *local_38;
  TCGTemp *local_30;
  
  if (((uint)ctx >> 0x19 & 1) != 0) {
    pTVar1 = tcg_const_i32_mips64el((TCGContext_conflict6 *)t,0x14);
    local_38 = (TCGTemp *)(t + *(long *)(t + 0xa8f0));
    local_30 = (TCGTemp *)(pTVar1 + (long)t);
    tcg_gen_callN_mips64el
              ((TCGContext_conflict6 *)t,helper_raise_exception_mips64el,(TCGTemp *)0x0,2,&local_38)
    ;
    tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)t,(TCGTemp *)(pTVar1 + (long)t));
  }
  ts = tcg_temp_new_internal_mips64el((TCGContext_conflict6 *)t,TCG_TYPE_I64,false);
  tcg_gen_extu_i32_i64_mips64el
            ((TCGContext_conflict6 *)t,(TCGv_i64)((long)ts - (long)t),
             (TCGv_i32)CONCAT44(in_register_00000014,reg));
  tcg_gen_deposit_i64_mips64el
            ((TCGContext_conflict6 *)t,*(TCGv_i64 *)(t + (ulong)in_ECX * 8 + 0xb040),
             *(TCGv_i64 *)(t + (ulong)in_ECX * 8 + 0xb040),(TCGv_i64)((long)ts - (long)t),0,0x20);
  tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)t,ts);
  return;
}

Assistant:

static void gen_store_fpr32(DisasContext *ctx, TCGv_i32 t, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t64;
    if (ctx->hflags & MIPS_HFLAG_FRE) {
        generate_exception(ctx, EXCP_RI);
    }
    t64 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_extu_i32_i64(tcg_ctx, t64, t);
    tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->fpu_f64[reg], tcg_ctx->fpu_f64[reg], t64, 0, 32);
    tcg_temp_free_i64(tcg_ctx, t64);
}